

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

_Bool get_quoted_string(HttpProxyNegotiator *s)

{
  size_t sVar1;
  bool bVar2;
  _Bool local_21;
  ulong local_20;
  size_t pos;
  HttpProxyNegotiator *s_local;
  
  local_20 = s->header_pos;
  while( true ) {
    local_21 = false;
    if (local_20 < s->header->len) {
      local_21 = is_whitespace(s->header->s[local_20]);
    }
    if (local_21 == false) break;
    local_20 = local_20 + 1;
  }
  if ((local_20 != s->header->len) && (s->header->s[local_20] == '\"')) {
    strbuf_clear(s->token);
    sVar1 = local_20;
    while( true ) {
      local_20 = sVar1 + 1;
      bVar2 = false;
      if (local_20 < s->header->len) {
        bVar2 = s->header->s[local_20] != '\"';
      }
      if (!bVar2) {
        if (local_20 != s->header->len) {
          s->header_pos = sVar1 + 2;
          return true;
        }
        return false;
      }
      if ((s->header->s[local_20] == '\\') && (local_20 = sVar1 + 2, local_20 == s->header->len))
      break;
      BinarySink_put_byte(s->token->binarysink_,s->header->s[local_20]);
      sVar1 = local_20;
    }
  }
  return false;
}

Assistant:

static bool get_quoted_string(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != '"')
        return false;
    pos++;

    strbuf_clear(s->token);
    while (pos < s->header->len && s->header->s[pos] != '"') {
        if (s->header->s[pos] == '\\') {
            /* Backslash makes the next char literal, even if it's " or \ */
            pos++;
            if (pos == s->header->len)
                return false;          /* unexpected end of string */
        }
        put_byte(s->token, s->header->s[pos++]);
    }

    if (pos == s->header->len)
        return false;                  /* no closing quote */
    pos++;

    s->header_pos = pos;
    return true;
}